

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O1

bool32 rw::instColor(int type,uint8 *dst,RGBA *src,uint32 numVertices,uint32 stride)

{
  uint8 *puVar1;
  long lVar2;
  byte bVar3;
  
  bVar3 = 0xff;
  if (type == 10) {
    if (numVertices != 0) {
      puVar1 = dst + 3;
      lVar2 = 0;
      do {
        puVar1[-3] = src[lVar2].blue;
        puVar1[-2] = src[lVar2].green;
        puVar1[-1] = src[lVar2].red;
        *puVar1 = src[lVar2].alpha;
        bVar3 = bVar3 & src[lVar2].alpha;
        lVar2 = lVar2 + 1;
        puVar1 = puVar1 + stride;
      } while (numVertices != (uint32)lVar2);
    }
  }
  else if ((type == 0xb) && (numVertices != 0)) {
    puVar1 = dst + 3;
    lVar2 = 0;
    do {
      puVar1[-3] = src[lVar2].red;
      puVar1[-2] = src[lVar2].green;
      puVar1[-1] = src[lVar2].blue;
      *puVar1 = src[lVar2].alpha;
      bVar3 = bVar3 & src[lVar2].alpha;
      lVar2 = lVar2 + 1;
      puVar1 = puVar1 + stride;
    } while (numVertices != (uint32)lVar2);
  }
  return (bool32)(bVar3 != 0xff);
}

Assistant:

bool32
instColor(int type, uint8 *dst, RGBA *src, uint32 numVertices, uint32 stride)
{
	uint8 alpha = 0xFF;
	if(type == VERT_ARGB){
		for(uint32 i = 0; i < numVertices; i++){
			dst[0] = src->blue;
			dst[1] = src->green;
			dst[2] = src->red;
			dst[3] = src->alpha;
			alpha &= src->alpha;
			dst += stride;
			src++;
		}
	}else if(type == VERT_RGBA){
		for(uint32 i = 0; i < numVertices; i++){
			dst[0] = src->red;
			dst[1] = src->green;
			dst[2] = src->blue;
			dst[3] = src->alpha;
			alpha &= src->alpha;
			dst += stride;
			src++;
		}
	}else
		assert(0 && "unsupported color type");
	return alpha != 0xFF;
}